

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix maths::Matrix::augment(Matrix *A,Matrix *B)

{
  double *pdVar1;
  Matrix *in_RDX;
  double **extraout_RDX;
  double **extraout_RDX_00;
  double **extraout_RDX_01;
  double **ppdVar2;
  Matrix *in_RSI;
  Matrix *in_RDI;
  Matrix MVar3;
  int j;
  int i;
  Matrix *AB;
  undefined8 in_stack_ffffffffffffff88;
  Matrix *in_stack_ffffffffffffff90;
  double dVar4;
  int local_24;
  int local_20;
  
  Matrix(in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
         (int)in_stack_ffffffffffffff88);
  ppdVar2 = extraout_RDX;
  for (local_20 = 0; local_20 < in_RDI->rows_; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < in_RDI->cols_; local_24 = local_24 + 1) {
      if (local_24 < in_RSI->cols_) {
        pdVar1 = operator()(in_RSI,local_20,local_24);
        dVar4 = *pdVar1;
        pdVar1 = operator()(in_RDI,local_20,local_24);
        *pdVar1 = dVar4;
        ppdVar2 = extraout_RDX_00;
      }
      else {
        pdVar1 = operator()(in_RDX,local_20,local_24 - in_RDX->cols_);
        dVar4 = *pdVar1;
        pdVar1 = operator()(in_RDI,local_20,local_24);
        *pdVar1 = dVar4;
        ppdVar2 = extraout_RDX_01;
      }
    }
  }
  MVar3.p = ppdVar2;
  MVar3._0_8_ = in_RDI;
  return MVar3;
}

Assistant:

Matrix Matrix::augment(Matrix A, Matrix B)
{
    Matrix AB(A.rows_, A.cols_ + B.cols_);
    for (int i = 0; i < AB.rows_; ++i) {
        for (int j = 0; j < AB.cols_; ++j) {
            if (j < A.cols_)
                AB(i, j) = A(i, j);
            else
                AB(i, j) = B(i, j - B.cols_);
        }
    }
    return AB;
}